

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O3

Language * Omega_h::yaml::build_language(void)

{
  pointer pTVar1;
  Language *in_RDI;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *local_38;
  
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->productions).
  super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->tokens).
  super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = &in_RDI->productions;
  build_productions(local_38);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&in_RDI->tokens,0x14);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"NEWLINE","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"((#[^\r\n]*)?\r?\n[ \t]*)+","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)pTVar1,(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1->regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"INDENT","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"((#[^\r\n]*)?\r?\n[ \t]*)+","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 1),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[1].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"DEDENT","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"((#[^\r\n]*)?\r?\n[ \t]*)+","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 2),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[2].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"WS","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"[ \t]","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 3),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[3].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,":","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,":","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 4),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[4].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,".","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\\.","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 5),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[5].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\\-","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 6),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[6].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"\"","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\"","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 7),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[7].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"\'","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\'","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 8),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[8].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"\\","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\\\\","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 9),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[9].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"|","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\\|","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 10),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[10].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"[","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\\[","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0xb),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0xb].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"]","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"\\]","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0xc),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0xc].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"{","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"{","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0xd),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0xd].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"}","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"}","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0xe),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0xe].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,">","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,">","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0xf),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0xf].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,",","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,",","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0x10),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0x10].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"%","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"%","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0x11),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0x11].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"!","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"!","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0x12),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0x12].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"OTHERCHAR","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"[^ \t:\\.\\-\"\'\\\\\\|\\[\\]{}>,%#!\n\r]","");
  pTVar1 = (in_RDI->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::operator=((string *)(pTVar1 + 0x13),(string *)local_78);
  std::__cxx11::string::operator=((string *)&pTVar1[0x13].regex,(string *)local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return in_RDI;
}

Assistant:

Language build_language() {
  Language out;
  auto& prods = out.productions;
  auto& toks = out.tokens;
  build_productions(prods);
  toks.resize(NTOKS);
  toks[TOK_NEWLINE] = {"NEWLINE", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_INDENT] = {"INDENT", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_DEDENT] = {"DEDENT", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_SPACE] = {"WS", "[ \t]"};
  toks[TOK_COLON] = {":", ":"};
  toks[TOK_DOT] = {".", "\\."};
  toks[TOK_DASH] = {"-", "\\-"};
  toks[TOK_DQUOT] = {"\"", "\""};
  toks[TOK_SQUOT] = {"'", "'"};
  toks[TOK_SLASH] = {"\\", "\\\\"};
  toks[TOK_PIPE] = {"|", "\\|"};
  toks[TOK_LSQUARE] = {"[", "\\["};
  toks[TOK_RSQUARE] = {"]", "\\]"};
  toks[TOK_LCURLY] = {"{", "{"};
  toks[TOK_RCURLY] = {"}", "}"};
  toks[TOK_RANGLE] = {">", ">"};
  toks[TOK_COMMA] = {",", ","};
  toks[TOK_PERCENT] = {"%", "%"};
  toks[TOK_EXCL] = {"!", "!"};
  toks[TOK_OTHER] = {"OTHERCHAR", "[^ \t:\\.\\-\"'\\\\\\|\\[\\]{}>,%#!\n\r]"};
  return out;
}